

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerResults.cpp
# Opt level: O1

bool __thiscall LINAnalyzerResults::IsFrameChecksum(LINAnalyzerResults *this,U64 frame_index)

{
  ulonglong *puVar1;
  U64 last_frame;
  U64 first_frame;
  U64 local_28;
  ulonglong local_20;
  
  puVar1 = (ulonglong *)AnalyzerResults::GetPacketContainingFrame((ulonglong)this);
  if ((puVar1 != (ulonglong *)0xffffffffffffffff) &&
     (AnalyzerResults::GetFramesContainedInPacket((ulonglong)this,puVar1,&local_20),
     local_28 == frame_index)) {
    return true;
  }
  return false;
}

Assistant:

bool LINAnalyzerResults::IsFrameChecksum( U64 frame_index )
{
    U64 packet_id = GetPacketContainingFrame( frame_index );
    if( packet_id != INVALID_RESULT_INDEX )
    {
        U64 first_frame;
        U64 last_frame;

        GetFramesContainedInPacket( packet_id, &first_frame, &last_frame );

        if( last_frame == frame_index )
            return true;
    }

    return false;
}